

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O0

void lowbd_inv_txfm2d_add_universe_avx2
               (int32_t *input,uint8_t *output,int stride,TX_TYPE tx_type,TX_SIZE tx_size,int eob)

{
  undefined1 in_CL;
  undefined4 in_EDX;
  int32_t *in_RSI;
  undefined1 in_R8B;
  int in_R9D;
  int32_t in_stack_00000424;
  TX_SIZE in_stack_0000042b;
  int in_stack_0000042c;
  uint8_t *in_stack_00000430;
  int32_t *in_stack_00000438;
  int in_stack_000008cc;
  TX_SIZE in_stack_000008d2;
  TX_TYPE in_stack_000008d3;
  int in_stack_000008d4;
  uint8_t *in_stack_000008d8;
  int32_t *in_stack_000008e0;
  int in_stack_00001284;
  TX_SIZE in_stack_0000128a;
  TX_TYPE in_stack_0000128b;
  int in_stack_0000128c;
  uint8_t *in_stack_00001290;
  int32_t *in_stack_00001298;
  int in_stack_00008b0c;
  TX_SIZE in_stack_00008b12;
  TX_TYPE in_stack_00008b13;
  int in_stack_00008b14;
  uint8_t *in_stack_00008b18;
  int32_t *in_stack_00008b20;
  TX_SIZE in_stack_ffffffffffffffe2;
  TX_TYPE in_stack_ffffffffffffffe3;
  undefined2 in_stack_ffffffffffffffe8;
  
  switch(in_CL) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
    lowbd_inv_txfm2d_add_no_identity_avx2
              (in_stack_00008b20,in_stack_00008b18,in_stack_00008b14,in_stack_00008b13,
               in_stack_00008b12,in_stack_00008b0c);
    break;
  case 9:
    lowbd_inv_txfm2d_add_idtx_avx2
              (in_stack_00000438,in_stack_00000430,in_stack_0000042c,in_stack_0000042b,
               in_stack_00000424);
    break;
  case 10:
  case 0xc:
  case 0xe:
    lowbd_inv_txfm2d_add_h_identity_avx2
              (in_stack_000008e0,in_stack_000008d8,in_stack_000008d4,in_stack_000008d3,
               in_stack_000008d2,in_stack_000008cc);
    break;
  case 0xb:
  case 0xd:
  case 0xf:
    lowbd_inv_txfm2d_add_v_identity_avx2
              (in_stack_00001298,in_stack_00001290,in_stack_0000128c,in_stack_0000128b,
               in_stack_0000128a,in_stack_00001284);
    break;
  default:
    av1_lowbd_inv_txfm2d_add_ssse3
              (in_RSI,(uint8_t *)
                      CONCAT44(in_EDX,CONCAT13(in_CL,CONCAT12(in_R8B,in_stack_ffffffffffffffe8))),
               in_R9D,in_stack_ffffffffffffffe3,in_stack_ffffffffffffffe2,0);
  }
  return;
}

Assistant:

static inline void lowbd_inv_txfm2d_add_universe_avx2(
    const int32_t *input, uint8_t *output, int stride, TX_TYPE tx_type,
    TX_SIZE tx_size, int eob) {
  (void)eob;
  switch (tx_type) {
    case DCT_DCT:
    case ADST_DCT:   // ADST in vertical, DCT in horizontal
    case DCT_ADST:   // DCT  in vertical, ADST in horizontal
    case ADST_ADST:  // ADST in both directions
    case FLIPADST_DCT:
    case DCT_FLIPADST:
    case FLIPADST_FLIPADST:
    case ADST_FLIPADST:
    case FLIPADST_ADST:
      lowbd_inv_txfm2d_add_no_identity_avx2(input, output, stride, tx_type,
                                            tx_size, eob);
      break;
    case IDTX:
      lowbd_inv_txfm2d_add_idtx_avx2(input, output, stride, tx_size, eob);
      break;
    case V_DCT:
    case V_ADST:
    case V_FLIPADST:
      lowbd_inv_txfm2d_add_h_identity_avx2(input, output, stride, tx_type,
                                           tx_size, eob);
      break;
    case H_DCT:
    case H_ADST:
    case H_FLIPADST:
      lowbd_inv_txfm2d_add_v_identity_avx2(input, output, stride, tx_type,
                                           tx_size, eob);
      break;
    default:
      av1_lowbd_inv_txfm2d_add_ssse3(input, output, stride, tx_type, tx_size,
                                     eob);
      break;
  }
}